

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledOutputFile.cpp
# Opt level: O3

void __thiscall
Imf_3_4::anon_unknown_6::TileBufferTask::TileBufferTask
          (TileBufferTask *this,TaskGroup *group,Data *ofd,int number,int dx,int dy,int lx,int ly)

{
  pointer ppTVar1;
  TileBuffer *pTVar2;
  
  IlmThread_3_4::Task::Task(&this->super_Task,group);
  *(undefined ***)this = &PTR__TileBufferTask_001e4480;
  this->_ofd = ofd;
  ppTVar1 = (ofd->tileBuffers).
            super__Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  this->_tileBuffer =
       ppTVar1[(ulong)(long)number %
               (ulong)((long)(ofd->tileBuffers).
                             super__Vector_base<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar1 >> 3)];
  IlmThread_3_4::Semaphore::wait();
  pTVar2 = this->_tileBuffer;
  *(int *)&pTVar2->compressor = dx;
  *(int *)((long)&pTVar2->compressor + 4) = dy;
  *(int *)&(pTVar2->sampleCountTableBuffer)._size = lx;
  *(int *)((long)&(pTVar2->sampleCountTableBuffer)._size + 4) = ly;
  return;
}

Assistant:

TileBufferTask::TileBufferTask (
    TaskGroup*             group,
    TiledOutputFile::Data* ofd,
    int                    number,
    int                    dx,
    int                    dy,
    int                    lx,
    int                    ly)
    : Task (group), _ofd (ofd), _tileBuffer (_ofd->getTileBuffer (number))
{
    //
    // Wait for the tileBuffer to become available
    //

    _tileBuffer->wait ();
    _tileBuffer->tileCoord = TileCoord (dx, dy, lx, ly);
}